

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
DoInitProperty_NoFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,Var instance)

{
  InlineCacheIndex inlineCacheIndex;
  FunctionBody *functionBody;
  PropertyId propertyId;
  InlineCache *inlineCache;
  RecyclableObject *object;
  Var newValue;
  
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  object = VarTo<Js::RecyclableObject>(instance);
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  newValue = GetReg<unsigned_int>(this,playout->Value);
  JavascriptOperators::PatchInitValue<false,Js::InlineCache>
            (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoInitProperty_NoFastPath(unaligned T* playout, Var instance)
    {
        JavascriptOperators::PatchInitValue<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            VarTo<RecyclableObject>(instance),
            GetPropertyIdFromCacheId(playout->inlineCacheIndex),
            GetReg(playout->Value));
    }